

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O2

optional<jbcoin::ValidatorToken> * __thiscall
jbcoin::ValidatorKeys::createValidatorToken
          (optional<jbcoin::ValidatorToken> *__return_storage_ptr__,ValidatorKeys *this,
          KeyType *keyType)

{
  KeyType type;
  Serializer s;
  SecretKey tokenSecret;
  STObject st;
  string m;
  PublicKey tokenPublic;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  SecretKey local_110;
  ValidatorToken local_f0;
  STObject local_b0;
  string local_80;
  PublicKey local_60;
  
  if ((this->revoked_ == false) && (this->tokenSequence_ < 0xfffffffe)) {
    this->tokenSequence_ = this->tokenSequence_ + 1;
    type = *keyType;
    randomSeed();
    generateSecretKey(&local_110,type,(Seed *)&local_f0);
    Seed::~Seed((Seed *)&local_f0);
    derivePublicKey(&local_60,*keyType,&local_110);
    STObject::STObject(&local_b0,(SField *)sfGeneric);
    STObject::Proxy<jbcoin::STInteger<unsigned_int>_>::Proxy
              ((Proxy<jbcoin::STInteger<unsigned_int>_> *)&local_f0,&local_b0,
               (TypedField<jbcoin::STInteger<unsigned_int>_> *)sfSequence);
    STObject::Proxy<jbcoin::STInteger<unsigned_int>>::assign<unsigned_int&>
              ((Proxy<jbcoin::STInteger<unsigned_int>> *)&local_f0,&this->tokenSequence_);
    STObject::Proxy<jbcoin::STBlob>::Proxy
              ((Proxy<jbcoin::STBlob> *)&local_f0,&local_b0,
               (TypedField<jbcoin::STBlob> *)sfPublicKey);
    STObject::Proxy<jbcoin::STBlob>::assign<jbcoin::PublicKey&>
              ((Proxy<jbcoin::STBlob> *)&local_f0,&this->publicKey_);
    STObject::Proxy<jbcoin::STBlob>::Proxy
              ((Proxy<jbcoin::STBlob> *)&local_f0,&local_b0,
               (TypedField<jbcoin::STBlob> *)sfSigningPubKey);
    STObject::Proxy<jbcoin::STBlob>::assign<jbcoin::PublicKey_const&>
              ((Proxy<jbcoin::STBlob> *)&local_f0,&local_60);
    jbcoin::sign((EVP_PKEY_CTX *)&local_b0,(uchar *)&HashPrefix::manifest,
                 (size_t *)(ulong)(uint)*keyType,local_110.buf_,0x303e18);
    jbcoin::sign((EVP_PKEY_CTX *)&local_b0,(uchar *)&HashPrefix::manifest,
                 (size_t *)(ulong)(uint)this->keyType_,(this->secretKey_).buf_,0x3041d8);
    Serializer::Serializer((Serializer *)&local_128,0x100);
    STObject::add(&local_b0,(Serializer *)&local_128);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,local_128._M_impl.super__Vector_impl_data._M_start,
               local_128._M_impl.super__Vector_impl_data._M_finish);
    beast::detail::base64_encode(&local_f0.manifest,&local_80);
    local_f0.secretKey.buf_[0x10] = local_110.buf_[0x10];
    local_f0.secretKey.buf_[0x11] = local_110.buf_[0x11];
    local_f0.secretKey.buf_[0x12] = local_110.buf_[0x12];
    local_f0.secretKey.buf_[0x13] = local_110.buf_[0x13];
    local_f0.secretKey.buf_[0x14] = local_110.buf_[0x14];
    local_f0.secretKey.buf_[0x15] = local_110.buf_[0x15];
    local_f0.secretKey.buf_[0x16] = local_110.buf_[0x16];
    local_f0.secretKey.buf_[0x17] = local_110.buf_[0x17];
    local_f0.secretKey.buf_[0x18] = local_110.buf_[0x18];
    local_f0.secretKey.buf_[0x19] = local_110.buf_[0x19];
    local_f0.secretKey.buf_[0x1a] = local_110.buf_[0x1a];
    local_f0.secretKey.buf_[0x1b] = local_110.buf_[0x1b];
    local_f0.secretKey.buf_[0x1c] = local_110.buf_[0x1c];
    local_f0.secretKey.buf_[0x1d] = local_110.buf_[0x1d];
    local_f0.secretKey.buf_[0x1e] = local_110.buf_[0x1e];
    local_f0.secretKey.buf_[0x1f] = local_110.buf_[0x1f];
    local_f0.secretKey.buf_[0] = local_110.buf_[0];
    local_f0.secretKey.buf_[1] = local_110.buf_[1];
    local_f0.secretKey.buf_[2] = local_110.buf_[2];
    local_f0.secretKey.buf_[3] = local_110.buf_[3];
    local_f0.secretKey.buf_[4] = local_110.buf_[4];
    local_f0.secretKey.buf_[5] = local_110.buf_[5];
    local_f0.secretKey.buf_[6] = local_110.buf_[6];
    local_f0.secretKey.buf_[7] = local_110.buf_[7];
    local_f0.secretKey.buf_[8] = local_110.buf_[8];
    local_f0.secretKey.buf_[9] = local_110.buf_[9];
    local_f0.secretKey.buf_[10] = local_110.buf_[10];
    local_f0.secretKey.buf_[0xb] = local_110.buf_[0xb];
    local_f0.secretKey.buf_[0xc] = local_110.buf_[0xc];
    local_f0.secretKey.buf_[0xd] = local_110.buf_[0xd];
    local_f0.secretKey.buf_[0xe] = local_110.buf_[0xe];
    local_f0.secretKey.buf_[0xf] = local_110.buf_[0xf];
    boost::optional_detail::optional_base<jbcoin::ValidatorToken>::optional_base
              (&__return_storage_ptr__->super_type);
    ValidatorToken::~ValidatorToken(&local_f0);
    std::__cxx11::string::~string((string *)&local_80);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_128);
    STObject::~STObject(&local_b0);
    SecretKey::~SecretKey(&local_110);
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<ValidatorToken>
ValidatorKeys::createValidatorToken (
    KeyType const& keyType)
{
    if (revoked () ||
            std::numeric_limits<std::uint32_t>::max () - 1 <= tokenSequence_)
        return boost::none;

    ++tokenSequence_;

    auto const tokenSecret = generateSecretKey (keyType, randomSeed ());
    auto const tokenPublic = derivePublicKey(keyType, tokenSecret);

    STObject st(sfGeneric);
    st[sfSequence] = tokenSequence_;
    st[sfPublicKey] = publicKey_;
    st[sfSigningPubKey] = tokenPublic;

    jbcoin::sign(st, HashPrefix::manifest, keyType, tokenSecret);

    jbcoin::sign(st, HashPrefix::manifest, keyType_, secretKey_,
        sfMasterSignature);

    Serializer s;
    st.add(s);

    std::string m (static_cast<char const*> (s.data()), s.size());
    return ValidatorToken {
        beast::detail::base64_encode(m), tokenSecret };
}